

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Index * sqlite3AllocateIndexObject(sqlite3 *db,i16 nCol,int nExtra,char **ppExtra)

{
  int iVar1;
  Index *pIVar2;
  char **ppcVar3;
  i16 *piVar4;
  char *pExtra;
  int nByte;
  Index *p;
  char **ppExtra_local;
  int nExtra_local;
  i16 nCol_local;
  sqlite3 *db_local;
  
  iVar1 = nCol * 8 + 0x98 + ((nCol + 1) * 2 + nCol * 2 + (int)nCol + 7U & 0xfffffff8);
  pIVar2 = (Index *)sqlite3DbMallocZero(db,(long)(iVar1 + nExtra));
  if (pIVar2 != (Index *)0x0) {
    pIVar2->azColl = &pIVar2[1].zName;
    ppcVar3 = &pIVar2[1].zName + nCol;
    pIVar2->aiRowLogEst = (LogEst *)ppcVar3;
    piVar4 = (i16 *)((long)ppcVar3 + (long)(nCol + 1) * 2);
    pIVar2->aiColumn = piVar4;
    pIVar2->aSortOrder = (u8 *)(piVar4 + nCol);
    pIVar2->nColumn = nCol;
    pIVar2->nKeyCol = nCol - 1;
    *ppExtra = (char *)((long)&pIVar2->zName + (long)iVar1);
  }
  return pIVar2;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3AllocateIndexObject(
  sqlite3 *db,         /* Database connection */
  i16 nCol,            /* Total number of columns in the index */
  int nExtra,          /* Number of bytes of extra space to alloc */
  char **ppExtra       /* Pointer to the "extra" space */
){
  Index *p;            /* Allocated index object */
  int nByte;           /* Bytes of space for Index object + arrays */

  nByte = ROUND8(sizeof(Index)) +              /* Index structure  */
          ROUND8(sizeof(char*)*nCol) +         /* Index.azColl     */
          ROUND8(sizeof(LogEst)*(nCol+1) +     /* Index.aiRowLogEst   */
                 sizeof(i16)*nCol +            /* Index.aiColumn   */
                 sizeof(u8)*nCol);             /* Index.aSortOrder */
  p = sqlite3DbMallocZero(db, nByte + nExtra);
  if( p ){
    char *pExtra = ((char*)p)+ROUND8(sizeof(Index));
    p->azColl = (const char**)pExtra; pExtra += ROUND8(sizeof(char*)*nCol);
    p->aiRowLogEst = (LogEst*)pExtra; pExtra += sizeof(LogEst)*(nCol+1);
    p->aiColumn = (i16*)pExtra;       pExtra += sizeof(i16)*nCol;
    p->aSortOrder = (u8*)pExtra;
    p->nColumn = nCol;
    p->nKeyCol = nCol - 1;
    *ppExtra = ((char*)p) + nByte;
  }
  return p;
}